

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O3

void __thiscall
Deque<int,_std::allocator<int>_>::Deque
          (Deque<int,_std::allocator<int>_> *this,Deque<int,_std::allocator<int>_> *other)

{
  size_type sVar1;
  DataBlock **ppDVar2;
  
  sVar1 = (other->current_).allocSize_;
  ppDVar2 = __gnu_cxx::new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocate
                      ((new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)this,sVar1,
                       (void *)0x0);
  (this->current_).arr_ = ppDVar2;
  (this->current_).begin_ = ppDVar2;
  (this->current_).end_ = ppDVar2;
  (this->current_).size_ = 0;
  (this->current_).allocSize_ = sVar1;
  sVar1 = (other->small_).allocSize_;
  ppDVar2 = __gnu_cxx::new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocate
                      ((new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)&this->small_
                       ,sVar1,(void *)0x0);
  (this->small_).arr_ = ppDVar2;
  (this->small_).begin_ = ppDVar2;
  (this->small_).end_ = ppDVar2;
  (this->small_).size_ = 0;
  (this->small_).allocSize_ = sVar1;
  sVar1 = (other->big_).allocSize_;
  ppDVar2 = __gnu_cxx::new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>::allocate
                      ((new_allocator<Deque<int,_std::allocator<int>_>::DataBlock_*> *)&this->big_,
                       sVar1,(void *)0x0);
  (this->big_).arr_ = ppDVar2;
  (this->big_).begin_ = ppDVar2;
  (this->big_).end_ = ppDVar2;
  (this->big_).size_ = 0;
  (this->big_).allocSize_ = sVar1;
  Deque<int,std::allocator<int>>::copy<std::allocator<int>>
            ((Deque<int,std::allocator<int>> *)this,other);
  return;
}

Assistant:

Deque(const Deque &other) :
            small_(other.small_.max_size()),
            current_(other.current_.max_size()),
            big_(other.big_.max_size()),
            allocator_() {
        copy(other);
    }